

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::printMedicine(Shop *this,int i)

{
  ostream *poVar1;
  Medicine medicine;
  undefined1 local_b0 [48];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ID");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Name");
  poVar1 = std::operator<<(poVar1,"\t\t");
  poVar1 = std::operator<<(poVar1,"Company Name");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Unit Price");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"In Stock");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Quantity");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Arrival Date");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Expire Date");
  std::endl<char,std::char_traits<char>>(poVar1);
  Medicine::Medicine((Medicine *)local_b0,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + i);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i + 1);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)(local_b0 + 0x10));
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,local_80);
  poVar1 = std::operator<<(poVar1,"\t    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_b0._4_4_);
  poVar1 = std::operator<<(poVar1,"\t\t   ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\t\t  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_b0._8_4_);
  poVar1 = std::operator<<(poVar1,"\t\t  ");
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  Medicine::~Medicine((Medicine *)local_b0);
  return;
}

Assistant:

void printMedicine(int i) {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        Medicine medicine = medicineList[i];
        cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
             << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
             << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
    }